

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
ezy::
join<std::__cxx11::string,ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,ezy::detail::drop_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,std::vector<int,std::allocator<int>>>>>,ezy::to_string_fn_const&>,std::basic_string_view<char,std::char_traits<char>>&>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,ezy *this,
          range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_ezy::detail::drop_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_std::vector<int,_std::allocator<int>_>_>_>_>,_const_ezy::to_string_fn_&>
          *range,basic_string_view<char,_std::char_traits<char>_> *separator)

{
  long *plVar1;
  int *piVar2;
  long lVar3;
  tuple<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_> tVar4;
  iterator_adaptor<ezy::detail::drop_iterator<const_std::vector<int,_std::allocator<int>_>_>,_const_ezy::to_string_fn_&>
  __first;
  iterator_adaptor<ezy::detail::drop_iterator<const_std::vector<int,_std::allocator<int>_>_>,_const_ezy::to_string_fn_&>
  __last;
  anon_class_24_2_e8cc7173 __f;
  long lVar5;
  int *t;
  long lVar6;
  int *piVar7;
  reference_wrapper<const_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff80;
  basic_string_view<char,_std::char_traits<char>_> in_stack_ffffffffffffffa0;
  
  plVar1 = (long *)**(long **)this;
  lVar5 = (*(long **)this)[1];
  t = (int *)*plVar1;
  piVar2 = (int *)plVar1[1];
  piVar7 = t;
  lVar6 = lVar5;
  if (lVar5 == 0 || t == piVar2) {
    if (t == piVar2) goto LAB_001bcba8;
  }
  else {
    do {
      lVar6 = lVar6 + -1;
      piVar7 = piVar7 + 1;
      if (piVar7 == piVar2) break;
    } while (lVar6 != 0);
    if (piVar7 == piVar2) {
LAB_001bcba8:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
    do {
      lVar5 = lVar5 + -1;
      t = t + 1;
      if (t == piVar2) break;
    } while (lVar5 != 0);
  }
  to_string_fn::operator()(__return_storage_ptr__,*(to_string_fn **)(this + 8),t);
  plVar1 = (long *)**(long **)this;
  lVar5 = (*(long **)this)[1];
  lVar6 = *plVar1;
  lVar3 = plVar1[1];
  if (lVar5 != 0 && lVar6 != lVar3) {
    do {
      lVar5 = lVar5 + -1;
      lVar6 = lVar6 + 4;
      if (lVar6 == lVar3) break;
    } while (lVar5 != 0);
  }
  tVar4.
  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  .
  super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_false>
  ._M_head_impl._M_current =
       (_Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
        )(range->orig_range).t;
  __first.
  super_basic_iterator_adaptor<ezy::detail::drop_iterator<const_std::vector<int,_std::allocator<int>_>_>_>
  .orig.tracker.current.
  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  .
  super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_false>
  ._M_head_impl._M_current =
       tVar4.
       super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
       .
       super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_false>
       ._M_head_impl._M_current;
  __first.
  super_basic_iterator_adaptor<ezy::detail::drop_iterator<const_std::vector<int,_std::allocator<int>_>_>_>
  .orig.tracker.ranges.
  super__Tuple_impl<0UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>_>.
  super__Head_base<0UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>,_false>
  ._M_head_impl._M_data =
       (_Tuple_impl<0UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>_>)
       (_Tuple_impl<0UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>_>)
       __return_storage_ptr__;
  __first.converter = range->transformation;
  __last.
  super_basic_iterator_adaptor<ezy::detail::drop_iterator<const_std::vector<int,_std::allocator<int>_>_>_>
  .orig.tracker.current.
  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  .
  super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_false>
  ._M_head_impl._M_current =
       (_Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
        )(_Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          )__return_storage_ptr__;
  __last.
  super_basic_iterator_adaptor<ezy::detail::drop_iterator<const_std::vector<int,_std::allocator<int>_>_>_>
  .orig.tracker.ranges.
  super__Tuple_impl<0UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>_>.
  super__Head_base<0UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>,_false>
  ._M_head_impl._M_data =
       (_Tuple_impl<0UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>_>)
       (_Tuple_impl<0UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>_>)
       in_stack_ffffffffffffff80._M_data;
  __last.converter =
       (to_string_fn *)
       tVar4.
       super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
       .
       super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_false>
       ._M_head_impl._M_current;
  __f.separator = in_stack_ffffffffffffffa0;
  __f.result = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               range->transformation;
  std::
  for_each<ezy::detail::iterator_adaptor<ezy::detail::drop_iterator<std::vector<int,std::allocator<int>>const>,ezy::to_string_fn_const&>,ezy::join<std::__cxx11::string,ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,ezy::detail::drop_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,std::vector<int,std::allocator<int>>>>>,ezy::to_string_fn_const&>,std::basic_string_view<char,std::char_traits<char>>&>(ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,ezy::detail::drop_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,std::vector<int,std::allocator<int>>>>>,ezy::to_string_fn_const&>&&,std::basic_string_view<char,std::char_traits<char>>&)::_lambda(auto:1_const&)_1_>
            ((anon_class_24_2_e8cc7173 *)&stack0xffffffffffffffa0,__first,__last,__f);
  return __return_storage_ptr__;
}

Assistant:

constexpr ReturnType join(Range&& range, Separator&& separator = Separator{})
  {
    using std::begin;
    using std::end;
    if (ezy::empty(range))
    {
      return ReturnType{};
    }
    else
    {
      ReturnType result{*begin(range)};
      std::for_each(
          std::next(begin(range)),
          end(range),
          [&result,separator](const auto& e)
          {
            result += separator;
            result += e;
          }
        );
      return result;
    }
  }